

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.hpp
# Opt level: O0

shared_ptr<helics::TranslatorOperator> __thiscall
helics::CustomTranslatorOperation::getOperator(CustomTranslatorOperation *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::TranslatorOperator> *in_RSI;
  element_type *in_RDI;
  shared_ptr<helics::TranslatorOperator> sVar1;
  
  std::shared_ptr<helics::TranslatorOperator>::shared_ptr
            (in_RSI,(shared_ptr<helics::TranslatorOperator> *)in_RDI);
  sVar1.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::TranslatorOperator>)
         sVar1.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<TranslatorOperator> getOperator() override { return to; }